

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_device_post_init(ma_device *pDevice,ma_device_type deviceType,
                             ma_device_descriptor *pDescriptorPlayback,
                             ma_device_descriptor *pDescriptorCapture)

{
  ma_channel *pmVar1;
  ma_data_converter *pConverter;
  void **ppvVar2;
  ma_uint32 mVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var6;
  ma_bool32 mVar9;
  uint uVar10;
  ma_result mVar11;
  ma_uint64 mVar12;
  ulong uVar13;
  void *pvVar14;
  char *pcVar15;
  ma_context *pmVar16;
  uint uVar17;
  ma_device_info_conflict deviceInfo;
  
  if (pDevice == (ma_device *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar17 = deviceType - ma_device_type_capture;
  if (uVar17 < 3) {
    mVar9 = ma_device_descriptor_is_valid(pDescriptorCapture);
    if (mVar9 == 0) {
      return MA_INVALID_ARGS;
    }
    mVar3 = pDescriptorCapture->channels;
    (pDevice->capture).internalFormat = pDescriptorCapture->format;
    (pDevice->capture).internalChannels = mVar3;
    (pDevice->capture).internalSampleRate = pDescriptorCapture->sampleRate;
    memcpy((pDevice->capture).internalChannelMap,pDescriptorCapture->channelMap,0xfe);
    mVar3 = pDescriptorCapture->periodSizeInFrames;
    (pDevice->capture).internalPeriodSizeInFrames = mVar3;
    (pDevice->capture).internalPeriods = pDescriptorCapture->periodCount;
    if (mVar3 == 0) {
      if (pDescriptorCapture->sampleRate == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (pDescriptorCapture->sampleRate * pDescriptorCapture->periodSizeInMilliseconds) /
                 1000;
      }
      (pDevice->capture).internalPeriodSizeInFrames = uVar10;
    }
  }
  if ((deviceType & ~ma_device_type_capture) == ma_device_type_playback) {
    mVar9 = ma_device_descriptor_is_valid(pDescriptorPlayback);
    if (mVar9 == 0) {
      return MA_INVALID_ARGS;
    }
    mVar3 = pDescriptorPlayback->channels;
    (pDevice->playback).internalFormat = pDescriptorPlayback->format;
    (pDevice->playback).internalChannels = mVar3;
    (pDevice->playback).internalSampleRate = pDescriptorPlayback->sampleRate;
    memcpy((pDevice->playback).internalChannelMap,pDescriptorPlayback->channelMap,0xfe);
    mVar3 = pDescriptorPlayback->periodSizeInFrames;
    (pDevice->playback).internalPeriodSizeInFrames = mVar3;
    (pDevice->playback).internalPeriods = pDescriptorPlayback->periodCount;
    if (mVar3 == 0) {
      if (pDescriptorPlayback->sampleRate == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (pDescriptorPlayback->sampleRate * pDescriptorPlayback->periodSizeInMilliseconds) /
                 1000;
      }
      (pDevice->playback).internalPeriodSizeInFrames = uVar10;
    }
  }
  if (uVar17 < 3) {
    mVar11 = ma_device_get_info(pDevice,(deviceType != ma_device_type_loopback) +
                                        ma_device_type_playback,&deviceInfo);
    if (mVar11 == MA_SUCCESS) {
      pcVar15 = deviceInfo.name;
    }
    else if (pDescriptorCapture->pDeviceID == (ma_device_id *)0x0) {
      pcVar15 = "Default Capture Device";
    }
    else {
      pcVar15 = "Capture Device";
    }
    ma_strncpy_s((pDevice->capture).name,0x100,pcVar15,0xffffffffffffffff);
  }
  if ((deviceType & ~ma_device_type_capture) == ma_device_type_playback) {
    mVar11 = ma_device_get_info(pDevice,ma_device_type_playback,&deviceInfo);
    if (mVar11 == MA_SUCCESS) {
      pcVar15 = deviceInfo.name;
    }
    else if (pDescriptorPlayback->pDeviceID == (ma_device_id *)0x0) {
      pcVar15 = "Default Playback Device";
    }
    else {
      pcVar15 = "Playback Device";
    }
    ma_strncpy_s((pDevice->playback).name,0x100,pcVar15,0xffffffffffffffff);
  }
  if (uVar17 < 3) {
    if ((pDevice->capture).format == ma_format_unknown) {
      (pDevice->capture).format = (pDevice->capture).internalFormat;
    }
    uVar10 = (pDevice->capture).channels;
    if (uVar10 == 0) {
      uVar10 = (pDevice->capture).internalChannels;
      (pDevice->capture).channels = uVar10;
    }
    if ((pDevice->capture).channelMap[0] == '\0') {
      if (0xfe < uVar10) {
        __assert_fail("pDevice->capture.channels <= 254",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x6d85,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      pmVar1 = (pDevice->capture).channelMap;
      if ((pDevice->capture).internalChannels == uVar10) {
        if (uVar10 != 0) {
          memcpy(pmVar1,(pDevice->capture).internalChannelMap,(ulong)uVar10);
        }
      }
      else if ((pDevice->capture).channelMixMode == ma_channel_mix_mode_simple) {
        if (uVar10 != 0) {
          memset(pmVar1,0,(ulong)uVar10);
        }
      }
      else {
        ma_channel_map_init_standard(ma_standard_channel_map_default,pmVar1,0xfe,uVar10);
      }
    }
    if (deviceType == ma_device_type_duplex) {
LAB_001850a6:
      if ((pDevice->playback).format == ma_format_unknown) {
        (pDevice->playback).format = (pDevice->playback).internalFormat;
      }
      uVar10 = (pDevice->playback).channels;
      if (uVar10 == 0) {
        uVar10 = (pDevice->playback).internalChannels;
        (pDevice->playback).channels = uVar10;
      }
      if ((pDevice->playback).channelMap[0] == '\0') {
        if (0xfe < uVar10) {
          __assert_fail("pDevice->playback.channels <= 254",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x6d9a,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)")
          ;
        }
        pmVar1 = (pDevice->playback).channelMap;
        if ((pDevice->playback).internalChannels == uVar10) {
          if (uVar10 != 0) {
            memcpy(pmVar1,(pDevice->playback).internalChannelMap,(ulong)uVar10);
          }
        }
        else if ((pDevice->playback).channelMixMode == ma_channel_mix_mode_simple) {
          if (uVar10 != 0) {
            memset(pmVar1,0,(ulong)uVar10);
          }
        }
        else {
          ma_channel_map_init_standard(ma_standard_channel_map_default,pmVar1,0xfe,uVar10);
        }
      }
    }
  }
  else if (deviceType == ma_device_type_playback) goto LAB_001850a6;
  deviceInfo.id.wasapi[5] = pDevice->sampleRate;
  if (deviceInfo.id.wasapi[5] == L'\0') {
    if (2 < uVar17) {
      pDevice->sampleRate = (pDevice->playback).internalSampleRate;
      goto LAB_00185263;
    }
    deviceInfo.id.wasapi[5] = (pDevice->capture).internalSampleRate;
    pDevice->sampleRate = deviceInfo.id.wasapi[5];
    deviceInfo.id.wasapi[4] = deviceInfo.id.wasapi[5];
  }
  else {
    if (2 < uVar17) goto LAB_00185263;
    deviceInfo.id.wasapi[4] = (pDevice->capture).internalSampleRate;
  }
  deviceInfo.id._72_8_ = 0;
  deviceInfo.id._80_8_ = 0;
  deviceInfo.id._56_8_ = 0;
  deviceInfo.id._64_8_ = 0;
  deviceInfo.id.wasapi[10] = L'\0';
  deviceInfo.id.wasapi[0xd] = L'\0';
  deviceInfo.id.wasapi[0] = (pDevice->capture).internalFormat;
  deviceInfo.id.wasapi[2] = (pDevice->capture).internalChannels;
  deviceInfo.id._24_8_ = (pDevice->capture).internalChannelMap;
  deviceInfo.id.wasapi[1] = (pDevice->capture).format;
  deviceInfo.id.wasapi[3] = (pDevice->capture).channels;
  deviceInfo.id._32_8_ = (pDevice->capture).channelMap;
  uVar4 = (pDevice->capture).channelMixMode;
  uVar7 = (pDevice->capture).calculateLFEFromSpatialChannels;
  deviceInfo.id.wasapi[0x17] = 0;
  deviceInfo.id.wasapi[0x16] = (pDevice->resampling).algorithm;
  deviceInfo.id.wasapi[0x1d] = 0;
  deviceInfo.id.wasapi[0x1c] = (pDevice->resampling).linear.lpfOrder;
  deviceInfo.id._96_8_ = (pDevice->resampling).pBackendVTable;
  deviceInfo.id._104_8_ = (pDevice->resampling).pBackendUserData;
  deviceInfo.id.wasapi[0xb] = uVar4;
  deviceInfo.id.wasapi[0xc] = uVar7;
  if (pDevice->state != ma_device_state_uninitialized) {
    ma_data_converter_uninit(&(pDevice->capture).converter,&pDevice->pContext->allocationCallbacks);
  }
  mVar11 = ma_data_converter_init
                     ((ma_data_converter_config *)&deviceInfo,
                      &pDevice->pContext->allocationCallbacks,&(pDevice->capture).converter);
  if (mVar11 != MA_SUCCESS) {
    return mVar11;
  }
LAB_00185263:
  mVar11 = MA_SUCCESS;
  if ((deviceType | ma_device_type_capture) == ma_device_type_duplex) {
    deviceInfo.id._72_8_ = 0;
    deviceInfo.id._80_8_ = 0;
    deviceInfo.id._56_8_ = 0;
    deviceInfo.id._64_8_ = 0;
    deviceInfo.id.wasapi[10] = L'\0';
    deviceInfo.id.wasapi[0xd] = L'\0';
    deviceInfo.id.wasapi[0] = (pDevice->playback).format;
    deviceInfo.id.wasapi[2] = (pDevice->playback).channels;
    deviceInfo.id.wasapi[4] = pDevice->sampleRate;
    deviceInfo.id._24_8_ = (pDevice->playback).channelMap;
    deviceInfo.id.wasapi[1] = (pDevice->playback).internalFormat;
    deviceInfo.id.wasapi[3] = (pDevice->playback).internalChannels;
    deviceInfo.id.wasapi[5] = (pDevice->playback).internalSampleRate;
    deviceInfo.id._32_8_ = (pDevice->playback).internalChannelMap;
    uVar5 = (pDevice->playback).channelMixMode;
    uVar8 = (pDevice->playback).calculateLFEFromSpatialChannels;
    deviceInfo.id.wasapi[0x17] = 0;
    deviceInfo.id.wasapi[0x16] = (pDevice->resampling).algorithm;
    deviceInfo.id.wasapi[0x1d] = 0;
    deviceInfo.id.wasapi[0x1c] = (pDevice->resampling).linear.lpfOrder;
    deviceInfo.id._96_8_ = (pDevice->resampling).pBackendVTable;
    deviceInfo.id._104_8_ = (pDevice->resampling).pBackendUserData;
    deviceInfo.id.wasapi[0xb] = uVar5;
    deviceInfo.id.wasapi[0xc] = uVar8;
    if (pDevice->state != ma_device_state_uninitialized) {
      ma_data_converter_uninit
                (&(pDevice->playback).converter,&pDevice->pContext->allocationCallbacks);
    }
    pConverter = &(pDevice->playback).converter;
    mVar11 = ma_data_converter_init
                       ((ma_data_converter_config *)&deviceInfo,
                        &pDevice->pContext->allocationCallbacks,pConverter);
    if (mVar11 == MA_SUCCESS) {
      (pDevice->playback).inputCacheConsumed = 0;
      (pDevice->playback).inputCacheRemaining = 0;
      if ((deviceType == ma_device_type_duplex) ||
         (mVar11 = ma_data_converter_get_required_input_frame_count
                             (pConverter,1,(ma_uint64 *)&deviceInfo), mVar11 != MA_SUCCESS)) {
        mVar12 = ma_calculate_frame_count_after_resampling
                           ((pDevice->playback).internalSampleRate,pDevice->sampleRate,
                            (ulong)(pDevice->playback).internalPeriodSizeInFrames);
        uVar13 = (*(int *)(&DAT_001ad680 + (ulong)(pDevice->playback).format * 4) *
                 (pDevice->playback).channels) * mVar12;
        ppvVar2 = &(pDevice->playback).pInputCache;
        pmVar16 = pDevice->pContext;
        if ((uVar13 >> 0x20 == 0) &&
           (p_Var6 = (pmVar16->allocationCallbacks).onRealloc,
           p_Var6 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0)) {
          pvVar14 = (*p_Var6)(*ppvVar2,uVar13,(pmVar16->allocationCallbacks).pUserData);
          if (pvVar14 != (void *)0x0) {
            (pDevice->playback).pInputCache = pvVar14;
            (pDevice->playback).inputCacheCap = mVar12;
            return MA_SUCCESS;
          }
          pmVar16 = pDevice->pContext;
        }
        ma_free(*ppvVar2,&pmVar16->allocationCallbacks);
        *ppvVar2 = (void *)0x0;
        (pDevice->playback).inputCacheCap = 0;
        mVar11 = MA_OUT_OF_MEMORY;
      }
      else {
        ma_free((pDevice->playback).pInputCache,&pDevice->pContext->allocationCallbacks);
        (pDevice->playback).pInputCache = (void *)0x0;
        (pDevice->playback).inputCacheCap = 0;
        mVar11 = MA_SUCCESS;
      }
    }
  }
  return mVar11;
}

Assistant:

MA_API ma_result ma_device_post_init(ma_device* pDevice, ma_device_type deviceType, const ma_device_descriptor* pDescriptorPlayback, const ma_device_descriptor* pDescriptorCapture)
{
    ma_result result;

    if (pDevice == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Capture. */
    if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
        if (ma_device_descriptor_is_valid(pDescriptorCapture) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->capture.internalFormat             = pDescriptorCapture->format;
        pDevice->capture.internalChannels           = pDescriptorCapture->channels;
        pDevice->capture.internalSampleRate         = pDescriptorCapture->sampleRate;
        MA_COPY_MEMORY(pDevice->capture.internalChannelMap, pDescriptorCapture->channelMap, sizeof(pDescriptorCapture->channelMap));
        pDevice->capture.internalPeriodSizeInFrames = pDescriptorCapture->periodSizeInFrames;
        pDevice->capture.internalPeriods            = pDescriptorCapture->periodCount;

        if (pDevice->capture.internalPeriodSizeInFrames == 0) {
            pDevice->capture.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorCapture->periodSizeInMilliseconds, pDescriptorCapture->sampleRate);
        }
    }

    /* Playback. */
    if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
        if (ma_device_descriptor_is_valid(pDescriptorPlayback) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->playback.internalFormat             = pDescriptorPlayback->format;
        pDevice->playback.internalChannels           = pDescriptorPlayback->channels;
        pDevice->playback.internalSampleRate         = pDescriptorPlayback->sampleRate;
        MA_COPY_MEMORY(pDevice->playback.internalChannelMap, pDescriptorPlayback->channelMap, sizeof(pDescriptorPlayback->channelMap));
        pDevice->playback.internalPeriodSizeInFrames = pDescriptorPlayback->periodSizeInFrames;
        pDevice->playback.internalPeriods            = pDescriptorPlayback->periodCount;

        if (pDevice->playback.internalPeriodSizeInFrames == 0) {
            pDevice->playback.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorPlayback->periodSizeInMilliseconds, pDescriptorPlayback->sampleRate);
        }
    }

    /*
    The name of the device can be retrieved from device info. This may be temporary and replaced with a `ma_device_get_info(pDevice, deviceType)` instead.
    For loopback devices, we need to retrieve the name of the playback device.
    */
    {
        ma_device_info deviceInfo;

        if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
            result = ma_device_get_info(pDevice, (deviceType == ma_device_type_loopback) ? ma_device_type_playback : ma_device_type_capture, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorCapture->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), "Capture Device", (size_t)-1);
                }
            }
        }

        if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
            result = ma_device_get_info(pDevice, ma_device_type_playback, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorPlayback->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), "Playback Device", (size_t)-1);
                }
            }
        }
    }

    /* Update data conversion. */
    return ma_device__post_init_setup(pDevice, deviceType); /* TODO: Should probably rename ma_device__post_init_setup() to something better. */
}